

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

path * __thiscall boost::filesystem::path::extension(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  long lVar2;
  path name;
  
  filename(&name,this);
  detail::dot_path();
  bVar1 = operator==(&name,&detail::dot_path::dot_pth);
  if (!bVar1) {
    detail::dot_dot_path();
    bVar1 = operator==(&name,&detail::dot_dot_path::dot_dot);
    if (!bVar1) {
      lVar2 = std::__cxx11::string::rfind((char)&name,0x2e);
      if (lVar2 != -1) {
        path(__return_storage_ptr__,name.m_pathname._M_dataplus._M_p + lVar2);
        goto LAB_0010f737;
      }
    }
  }
  (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_pathname).field_2;
  (__return_storage_ptr__->m_pathname)._M_string_length = 0;
  (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
LAB_0010f737:
  std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

path path::extension() const
  {
    path name(filename());
    if (name == detail::dot_path() || name == detail::dot_dot_path()) return path();
    size_type pos(name.m_pathname.rfind(dot));
    return pos == string_type::npos
      ? path()
      : path(name.m_pathname.c_str() + pos);
  }